

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  ImWchar IVar7;
  undefined2 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  ImFontGlyph *pIVar13;
  int iVar14;
  float *pfVar15;
  ImFontGlyph *pIVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  
  uVar18 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar18 == 0) {
    uVar19 = 1;
  }
  else {
    lVar17 = 0;
    uVar19 = 0;
    do {
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar17);
      uVar12 = (uint)uVar1;
      if (uVar1 < uVar19) {
        uVar12 = uVar19;
      }
      uVar19 = uVar12;
      lVar17 = lVar17 + 0x28;
    } while (uVar18 * 0x28 != lVar17);
    uVar19 = uVar19 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  GrowIndex(this,uVar19);
  iVar2 = (this->Glyphs).Size;
  lVar17 = (long)iVar2;
  if (0 < lVar17) {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar15 = &((this->Glyphs).Data)->AdvanceX;
    lVar20 = 0;
    do {
      uVar1 = ((ImFontGlyph *)(pfVar15 + -1))->Codepoint;
      pfVar3[uVar1] = *pfVar15;
      puVar4[uVar1] = (unsigned_short)lVar20;
      lVar20 = lVar20 + 1;
      pfVar15 = pfVar15 + 10;
    } while (lVar17 != lVar20);
  }
  iVar14 = (this->IndexLookup).Size;
  if ((iVar14 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28))
    ;
  }
  if (pIVar13 != (ImFontGlyph *)0x0) {
    pIVar13 = (this->Glyphs).Data;
    if (pIVar13[lVar17 + -1].Codepoint != 9) {
      iVar22 = iVar2 + 1;
      iVar21 = (this->Glyphs).Capacity;
      if (iVar21 <= iVar2) {
        if (iVar21 == 0) {
          iVar21 = 8;
        }
        else {
          iVar21 = iVar21 / 2 + iVar21;
        }
        if (iVar21 <= iVar22) {
          iVar21 = iVar22;
        }
        pIVar13 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar21 * 0x28);
        pIVar16 = (this->Glyphs).Data;
        if (pIVar16 != (ImFontGlyph *)0x0) {
          memcpy(pIVar13,pIVar16,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar13;
        (this->Glyphs).Capacity = iVar21;
        iVar14 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = iVar22;
      lVar17 = (long)iVar22;
    }
    if ((iVar14 < 0x21) || (uVar18 = (ulong)(this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
      pIVar16 = this->FallbackGlyph;
    }
    else {
      pIVar16 = pIVar13 + uVar18;
    }
    fVar23 = pIVar16->V1;
    pIVar13[lVar17 + -1].U1 = pIVar16->U1;
    pIVar13[lVar17 + -1].V1 = fVar23;
    IVar7 = pIVar16->Codepoint;
    uVar8 = *(undefined2 *)&pIVar16->field_0x2;
    fVar9 = pIVar16->AdvanceX;
    fVar10 = pIVar16->X0;
    fVar11 = pIVar16->Y0;
    fVar23 = pIVar16->Y1;
    fVar5 = pIVar16->U0;
    fVar6 = pIVar16->V0;
    pIVar13[lVar17 + -1].X1 = pIVar16->X1;
    pIVar13[lVar17 + -1].Y1 = fVar23;
    pIVar13[lVar17 + -1].U0 = fVar5;
    pIVar13[lVar17 + -1].V0 = fVar6;
    pIVar16 = pIVar13 + lVar17 + -1;
    pIVar16->Codepoint = IVar7;
    *(undefined2 *)&pIVar16->field_0x2 = uVar8;
    pIVar16->AdvanceX = fVar9;
    pIVar13[lVar17 + -1].X0 = fVar10;
    pIVar13[lVar17 + -1].Y0 = fVar11;
    pIVar13[lVar17 + -1].Codepoint = 9;
    fVar23 = pIVar13[lVar17 + -1].AdvanceX * 4.0;
    pIVar13[lVar17 + -1].AdvanceX = fVar23;
    (this->IndexAdvanceX).Data[9] = fVar23;
    (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
    iVar14 = (this->IndexLookup).Size;
  }
  if (((int)(uint)this->FallbackChar < iVar14) &&
     (uVar18 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar18 != 0xffff)) {
    pIVar16 = (this->Glyphs).Data;
    pIVar13 = pIVar16 + uVar18;
    this->FallbackGlyph = pIVar13;
    if (pIVar16 != (ImFontGlyph *)0x0) {
      fVar23 = pIVar13->AdvanceX;
      goto LAB_00136277;
    }
  }
  else {
    this->FallbackGlyph = (ImFontGlyph *)0x0;
  }
  fVar23 = 0.0;
LAB_00136277:
  this->FallbackAdvanceX = fVar23;
  pfVar3 = (this->IndexAdvanceX).Data;
  uVar18 = 0;
  do {
    pfVar15 = pfVar3 + uVar18;
    if (*pfVar15 <= 0.0 && *pfVar15 != 0.0) {
      pfVar3[uVar18] = fVar23;
    }
    uVar18 = uVar18 + 1;
  } while (uVar19 != uVar18);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}